

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_int,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,uint value,bool negative)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  char_t buf [64];
  undefined8 uStack_50;
  byte abStack_48 [72];
  
  uVar4 = (ulong)(uint)-(int)header_mask;
  if (value == 0) {
    uVar4 = header_mask & 0xffffffff;
  }
  lVar1 = 0x3f;
  uVar7 = (ulong)(value + 1 & 1) ^ 0xffffffffffffffc1;
  do {
    uVar6 = uVar7;
    lVar5 = lVar1;
    uVar3 = (uint)uVar4;
    abStack_48[lVar5] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
    uVar7 = uVar6 + 1;
    uVar4 = uVar4 / 10;
    lVar1 = lVar5 + -1;
  } while (9 < uVar3);
  abStack_48[lVar5 + -1] = 0x2d;
  uStack_50 = 0x156775;
  bVar2 = strcpy_insitu<char*,unsigned_long>
                    (dest,header,0x10,(char_t *)(abStack_48 + -uVar7),uVar6 + 0x41);
  return bVar2;
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}